

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

shared_ptr<tchecker::clockbounds::global_m_map_t> __thiscall
tchecker::clockbounds::clockbounds_t::global_m_map(clockbounds_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tchecker::clockbounds::global_m_map_t> sVar1;
  clockbounds_t *this_local;
  
  std::shared_ptr<tchecker::clockbounds::global_m_map_t>::shared_ptr
            ((shared_ptr<tchecker::clockbounds::global_m_map_t> *)this,
             (shared_ptr<tchecker::clockbounds::global_m_map_t> *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<tchecker::clockbounds::global_m_map_t>)
         sVar1.super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<tchecker::clockbounds::global_m_map_t> clockbounds_t::global_m_map() { return _global_m; }